

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode JsGetModuleNamespace(JsModuleRecord requestModule,JsValueRef *moduleNamespace)

{
  JsErrorCode JVar1;
  int iVar2;
  SourceTextModuleRecord *pSVar3;
  undefined4 extraout_var;
  
  if (moduleNamespace != (JsValueRef *)0x0) {
    *moduleNamespace = (JsValueRef)0x0;
    JVar1 = JsErrorInvalidArgument;
    if ((requestModule != (JsModuleRecord)0x0) && (*(int *)((long)requestModule + 8) == 0x65646f4d))
    {
      pSVar3 = Js::SourceTextModuleRecord::FromHost(requestModule);
      JVar1 = JsErrorModuleNotEvaluated;
      if (((pSVar3->super_ModuleRecordBase).wasEvaluated == true) &&
         (JVar1 = JsErrorInvalidArgument, (pSVar3->errorObject).ptr == (void *)0x0)) {
        iVar2 = (*(pSVar3->super_ModuleRecordBase).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[6])();
        *moduleNamespace = (JsValueRef)CONCAT44(extraout_var,iVar2);
        JVar1 = JsNoError;
      }
    }
    return JVar1;
  }
  return JsErrorNullArgument;
}

Assistant:

CHAKRA_API JsGetModuleNamespace(_In_ JsModuleRecord requestModule, _Outptr_result_maybenull_ JsValueRef *moduleNamespace)
{
    PARAM_NOT_NULL(moduleNamespace);
    *moduleNamespace = nullptr;
    if (!Js::SourceTextModuleRecord::Is(requestModule))
    {
        return JsErrorInvalidArgument;
    }
    Js::SourceTextModuleRecord* moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
    if (!moduleRecord->WasEvaluated())
    {
        return JsErrorModuleNotEvaluated;
    }
    if (moduleRecord->GetErrorObject() != nullptr)
    {
        return JsErrorInvalidArgument;
    }
    *moduleNamespace = static_cast<JsValueRef>(moduleRecord->GetNamespace());
    return JsNoError;
}